

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O2

Id __thiscall QAccessibleCache::acquireId(QAccessibleCache *this)

{
  Id IVar1;
  bool bVar2;
  
  while (bVar2 = QHash<unsigned_int,_QAccessibleInterface_*>::contains
                           ((QHash<unsigned_int,_QAccessibleInterface_*> *)(this + 0x10),
                            &acquireId::nextId), IVar1 = acquireId::nextId, bVar2) {
    bVar2 = acquireId::nextId == 0xfffffffe;
    acquireId::nextId = acquireId::nextId + 1;
    if (bVar2) {
      acquireId::nextId = 0x80000000;
    }
  }
  acquireId::nextId = acquireId::nextId + 1;
  return IVar1;
}

Assistant:

QAccessible::Id QAccessibleCache::acquireId() const
{
    static const QAccessible::Id FirstId = QAccessible::Id(INT_MAX) + 1;
    static QAccessible::Id nextId = FirstId;

    while (idToInterface.contains(nextId)) {
        // (wrap back when when we reach UINT_MAX - 1)
        // -1 because on Android -1 is taken for the "View" so just avoid it completely for consistency
        if (nextId == UINT_MAX - 1)
            nextId = FirstId;
        else
            ++nextId;
    }

    return nextId++;
}